

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_usage.cpp
# Opt level: O0

void KokkosTools::MemoryUsage::kokkosp_finalize_library(void)

{
  __tuple_element_t<0UL,_tuple<double,_unsigned_long,_double>_> _Var1;
  __tuple_element_t<1UL,_tuple<double,_unsigned_long,_double>_> _Var2;
  uint uVar3;
  char *__name;
  char *__s;
  FILE *__stream;
  size_type sVar4;
  reference pvVar5;
  __tuple_element_t<1UL,_tuple<double,_unsigned_long,_double>_> *p_Var6;
  __tuple_element_t<0UL,_tuple<double,_unsigned_long,_double>_> *p_Var7;
  __tuple_element_t<2UL,_tuple<double,_unsigned_long,_double>_> *p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint local_34;
  __tuple_element_t<1UL,_tuple<double,_unsigned_long,_double>_> _Stack_30;
  uint i;
  uint64_t maxvalue;
  FILE *ofile;
  char *fileOutput;
  int s;
  int pid;
  char *hostname;
  
  __name = (char *)malloc(0x100);
  gethostname(__name,0x100);
  uVar3 = getpid();
  for (fileOutput._0_4_ = 0; (int)fileOutput < num_spaces; fileOutput._0_4_ = (int)fileOutput + 1) {
    __s = (char *)malloc(0x100);
    snprintf(__s,0x100,"%s-%d-%s.memspace_usage",__name,(ulong)uVar3,
             space_name + (long)(int)fileOutput * 0x40);
    __stream = fopen(__s,"wb");
    free(__s);
    fprintf(__stream,"# Space %s\n",space_name + (long)(int)fileOutput * 0x40);
    fprintf(__stream,"# Time(s)  Size(MB)   HighWater(MB)   HighWater-Process(MB)\n");
    _Stack_30 = 0;
    local_34 = 0;
    while( true ) {
      sVar4 = std::
              vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
              ::size((vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
                      *)(space_size_track + (long)(int)fileOutput * 0x18));
      if (sVar4 <= local_34) break;
      pvVar5 = std::
               vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
               ::operator[]((vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
                             *)(space_size_track + (long)(int)fileOutput * 0x18),(ulong)local_34);
      p_Var6 = std::get<1ul,double,unsigned_long,double>(pvVar5);
      if (_Stack_30 < *p_Var6) {
        pvVar5 = std::
                 vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
                 ::operator[]((vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
                               *)(space_size_track + (long)(int)fileOutput * 0x18),(ulong)local_34);
        p_Var6 = std::get<1ul,double,unsigned_long,double>(pvVar5);
        _Stack_30 = *p_Var6;
      }
      pvVar5 = std::
               vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
               ::operator[]((vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
                             *)(space_size_track + (long)(int)fileOutput * 0x18),(ulong)local_34);
      p_Var7 = std::get<0ul,double,unsigned_long,double>(pvVar5);
      _Var1 = *p_Var7;
      pvVar5 = std::
               vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
               ::operator[]((vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
                             *)(space_size_track + (long)(int)fileOutput * 0x18),(ulong)local_34);
      p_Var6 = std::get<1ul,double,unsigned_long,double>(pvVar5);
      _Var2 = *p_Var6;
      auVar9._8_4_ = (int)(_Var2 >> 0x20);
      auVar9._0_8_ = _Var2;
      auVar9._12_4_ = 0x45300000;
      auVar10._8_4_ = (int)(_Stack_30 >> 0x20);
      auVar10._0_8_ = _Stack_30;
      auVar10._12_4_ = 0x45300000;
      pvVar5 = std::
               vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
               ::operator[]((vector<std::tuple<double,_unsigned_long,_double>,_std::allocator<std::tuple<double,_unsigned_long,_double>_>_>
                             *)(space_size_track + (long)(int)fileOutput * 0x18),(ulong)local_34);
      p_Var8 = std::get<2ul,double,unsigned_long,double>(pvVar5);
      fprintf(__stream,"%lf %.1lf %.1lf %.1lf\n",_Var1,
              ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0)) * 0.0009765625 *
              0.0009765625,
              ((((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)_Stack_30) - 4503599627370496.0)) * 1.0) / 1024.0)
              / 1024.0,((*p_Var8 * 1.0) / 1024.0) / 1024.0);
      local_34 = local_34 + 1;
    }
    fclose(__stream);
  }
  free(__name);
  return;
}

Assistant:

void kokkosp_finalize_library() {
  char* hostname = (char*)malloc(sizeof(char) * 256);
  gethostname(hostname, 256);
  int pid = getpid();

  for (int s = 0; s < num_spaces; s++) {
    char* fileOutput = (char*)malloc(sizeof(char) * 256);
    snprintf(fileOutput, 256, "%s-%d-%s.memspace_usage", hostname, pid,
             space_name[s]);

    FILE* ofile = fopen(fileOutput, "wb");
    free(fileOutput);

    fprintf(ofile, "# Space %s\n", space_name[s]);
    fprintf(ofile,
            "# Time(s)  Size(MB)   HighWater(MB)   HighWater-Process(MB)\n");
    uint64_t maxvalue = 0;
    for (unsigned int i = 0; i < space_size_track[s].size(); i++) {
      if (std::get<1>(space_size_track[s][i]) > maxvalue)
        maxvalue = std::get<1>(space_size_track[s][i]);
      fprintf(ofile, "%lf %.1lf %.1lf %.1lf\n",
              std::get<0>(space_size_track[s][i]),
              1.0 * std::get<1>(space_size_track[s][i]) / 1024 / 1024,
              1.0 * maxvalue / 1024 / 1024,
              1.0 * std::get<2>(space_size_track[s][i]) / 1024 / 1024);
    }
    fclose(ofile);
  }
  free(hostname);
}